

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue async_func_resume(JSContext *ctx,JSAsyncFunctionState *s)

{
  uintptr_t sp;
  JSValue func_obj;
  JSValue JVar1;
  uint uStack_1c;
  
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowInternalError(ctx,"stack overflow");
    JVar1 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    JVar1.tag = 3;
    JVar1.u.ptr = (void *)((ulong)uStack_1c << 0x20);
    func_obj.tag = 0;
    func_obj.u.ptr = s;
    JVar1 = JS_CallInternal(ctx,func_obj,s->this_val,JVar1,s->argc,(s->frame).arg_buf,4);
  }
  return JVar1;
}

Assistant:

static JSValue async_func_resume(JSContext *ctx, JSAsyncFunctionState *s)
{
    JSValue func_obj;

    if (js_check_stack_overflow(ctx->rt, 0))
        return JS_ThrowStackOverflow(ctx);

    /* the tag does not matter provided it is not an object */
    func_obj = JS_MKPTR(JS_TAG_INT, s);
    return JS_CallInternal(ctx, func_obj, s->this_val, JS_UNDEFINED,
                           s->argc, s->frame.arg_buf, JS_CALL_FLAG_GENERATOR);
}